

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman_utils.c
# Opt level: O0

int VP8LBuildHuffmanTable
              (HuffmanCode *root_table,int root_bits,int *code_lengths,int code_lengths_size)

{
  void *pvVar1;
  int in_ECX;
  long in_RDI;
  uint16_t *sorted_1;
  uint16_t sorted [512];
  int total_size;
  size_t in_stack_fffffffffffffbd0;
  uint64_t in_stack_fffffffffffffbd8;
  uint16_t *in_stack_fffffffffffffc88;
  int in_stack_fffffffffffffc94;
  int *in_stack_fffffffffffffc98;
  int in_stack_fffffffffffffca4;
  HuffmanCode *in_stack_fffffffffffffca8;
  int local_28;
  
  if (in_RDI == 0) {
    local_28 = BuildHuffmanTable(in_stack_fffffffffffffca8,in_stack_fffffffffffffca4,
                                 in_stack_fffffffffffffc98,in_stack_fffffffffffffc94,
                                 in_stack_fffffffffffffc88);
  }
  else if (in_ECX < 0x201) {
    local_28 = BuildHuffmanTable(in_stack_fffffffffffffca8,in_stack_fffffffffffffca4,
                                 in_stack_fffffffffffffc98,in_stack_fffffffffffffc94,
                                 in_stack_fffffffffffffc88);
  }
  else {
    pvVar1 = WebPSafeMalloc(in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0);
    if (pvVar1 == (void *)0x0) {
      return 0;
    }
    local_28 = BuildHuffmanTable(in_stack_fffffffffffffca8,in_stack_fffffffffffffca4,
                                 in_stack_fffffffffffffc98,in_stack_fffffffffffffc94,
                                 in_stack_fffffffffffffc88);
    WebPSafeFree((void *)0x1617c2);
  }
  return local_28;
}

Assistant:

int VP8LBuildHuffmanTable(HuffmanCode* const root_table, int root_bits,
                          const int code_lengths[], int code_lengths_size) {
  int total_size;
  assert(code_lengths_size <= MAX_CODE_LENGTHS_SIZE);
  if (root_table == NULL) {
    total_size = BuildHuffmanTable(NULL, root_bits,
                                   code_lengths, code_lengths_size, NULL);
  } else if (code_lengths_size <= SORTED_SIZE_CUTOFF) {
    // use local stack-allocated array.
    uint16_t sorted[SORTED_SIZE_CUTOFF];
    total_size = BuildHuffmanTable(root_table, root_bits,
                                   code_lengths, code_lengths_size, sorted);
  } else {   // rare case. Use heap allocation.
    uint16_t* const sorted =
        (uint16_t*)WebPSafeMalloc(code_lengths_size, sizeof(*sorted));
    if (sorted == NULL) return 0;
    total_size = BuildHuffmanTable(root_table, root_bits,
                                   code_lengths, code_lengths_size, sorted);
    WebPSafeFree(sorted);
  }
  return total_size;
}